

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ellswift_decode(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *ell64)

{
  uchar *in_RCX;
  uchar *data;
  secp256k1_fe *data_00;
  secp256k1_fe *out32;
  uchar *in_R8;
  secp256k1_ge_storage s;
  secp256k1_fe t;
  secp256k1_fe u;
  secp256k1_ge p;
  secp256k1_sha256 sStack_1d0;
  secp256k1_pubkey *psStack_160;
  secp256k1_fe *psStack_158;
  undefined8 uStack_150;
  uchar *puStack_148;
  secp256k1_fe *psStack_140;
  secp256k1_ge_storage local_130;
  secp256k1_fe local_f0;
  secp256k1_fe local_c0;
  secp256k1_ge local_90;
  
  if (ctx == (secp256k1_context *)0x0) {
    psStack_140 = (secp256k1_fe *)0x124017;
    secp256k1_ellswift_decode_cold_4();
  }
  else if (pubkey != (secp256k1_pubkey *)0x0) {
    if (ell64 == (uchar *)0x0) {
      psStack_140 = (secp256k1_fe *)0x124023;
      secp256k1_ellswift_decode_cold_2();
      return 0;
    }
    psStack_140 = (secp256k1_fe *)0x123f53;
    secp256k1_fe_impl_set_b32_mod(&local_c0,ell64);
    local_c0.magnitude = 1;
    local_c0.normalized = 0;
    psStack_140 = (secp256k1_fe *)0x123f65;
    secp256k1_fe_verify(&local_c0);
    psStack_140 = (secp256k1_fe *)0x123f79;
    secp256k1_fe_impl_set_b32_mod(&local_f0,ell64 + 0x20);
    local_f0.magnitude = 1;
    local_f0.normalized = 0;
    psStack_140 = (secp256k1_fe *)0x123f86;
    secp256k1_fe_verify(&local_f0);
    psStack_140 = (secp256k1_fe *)0x123f8e;
    secp256k1_fe_normalize_var(&local_f0);
    psStack_140 = (secp256k1_fe *)0x123f9e;
    data_00 = &local_c0;
    secp256k1_ellswift_xswiftec_var((secp256k1_fe *)&local_130,&local_c0,&local_f0);
    psStack_140 = (secp256k1_fe *)0x123fa6;
    out32 = &local_f0;
    secp256k1_fe_verify(&local_f0);
    if (local_f0.normalized == 0) {
      psStack_140 = (secp256k1_fe *)ellswift_xdh_hash_function_prefix;
      secp256k1_ellswift_decode_cold_1();
      uStack_150 = 1;
      sStack_1d0.s[0] = 0x6a09e667;
      sStack_1d0.s[1] = 0xbb67ae85;
      sStack_1d0.s[2] = 0x3c6ef372;
      sStack_1d0.s[3] = 0xa54ff53a;
      sStack_1d0.s[4] = 0x510e527f;
      sStack_1d0.s[5] = 0x9b05688c;
      sStack_1d0.s[6] = 0x1f83d9ab;
      sStack_1d0.s[7] = 0x5be0cd19;
      sStack_1d0.bytes = 0;
      psStack_160 = pubkey;
      psStack_158 = &local_f0;
      puStack_148 = ell64 + 0x20;
      psStack_140 = &local_c0;
      secp256k1_sha256_write(&sStack_1d0,in_R8,0x40);
      secp256k1_sha256_write(&sStack_1d0,data,0x40);
      secp256k1_sha256_write(&sStack_1d0,in_RCX,0x40);
      secp256k1_sha256_write(&sStack_1d0,(uchar *)data_00,0x20);
      secp256k1_sha256_finalize(&sStack_1d0,(uchar *)out32);
      return 1;
    }
    psStack_140 = (secp256k1_fe *)0x123fca;
    secp256k1_ge_set_xo_var(&local_90,(secp256k1_fe *)&local_130,(uint)local_f0.n[0] & 1);
    psStack_140 = (secp256k1_fe *)0x123fda;
    secp256k1_ge_to_storage(&local_130,&local_90);
    *(uint64_t *)(pubkey->data + 0x30) = local_130.y.n[2];
    *(uint64_t *)(pubkey->data + 0x38) = local_130.y.n[3];
    *(uint64_t *)(pubkey->data + 0x20) = local_130.y.n[0];
    *(uint64_t *)(pubkey->data + 0x28) = local_130.y.n[1];
    *(uint64_t *)(pubkey->data + 0x10) = local_130.x.n[2];
    *(uint64_t *)(pubkey->data + 0x18) = local_130.x.n[3];
    *(uint64_t *)pubkey->data = local_130.x.n[0];
    *(uint64_t *)(pubkey->data + 8) = local_130.x.n[1];
    return 1;
  }
  psStack_140 = (secp256k1_fe *)0x12401c;
  secp256k1_ellswift_decode_cold_3();
  return 0;
}

Assistant:

int secp256k1_ellswift_decode(const secp256k1_context *ctx, secp256k1_pubkey *pubkey, const unsigned char *ell64) {
    secp256k1_fe u, t;
    secp256k1_ge p;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(ell64 != NULL);

    secp256k1_fe_set_b32_mod(&u, ell64);
    secp256k1_fe_set_b32_mod(&t, ell64 + 32);
    secp256k1_fe_normalize_var(&t);
    secp256k1_ellswift_swiftec_var(&p, &u, &t);
    secp256k1_pubkey_save(pubkey, &p);
    return 1;
}